

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ringbuf.c
# Opt level: O1

adt_buf_err_t
adt_rbfh_createEx(adt_rbfh_t *self,uint8_t u8ElemSize,uint16_t u16MinNumElems,
                 uint16_t u16MaxNumElems)

{
  uint8_t *puVar1;
  adt_buf_err_t aVar2;
  undefined3 in_register_00000031;
  
  aVar2 = '\x01';
  if ((CONCAT31(in_register_00000031,u8ElemSize) != 0 && self != (adt_rbfh_t *)0x0) &&
     (u16MinNumElems <= (ushort)(u16MaxNumElems - 1))) {
    if (u16MinNumElems == 0) {
      self->u8AllocBuf = (uint8_t *)0x0;
    }
    else {
      puVar1 = (uint8_t *)
               malloc((ulong)u16MinNumElems * (ulong)CONCAT31(in_register_00000031,u8ElemSize));
      self->u8AllocBuf = puVar1;
      if (puVar1 == (uint8_t *)0x0) {
        return '\x01';
      }
    }
    self->u16NumElem = 0;
    self->u16AllocLen = u16MinNumElems;
    aVar2 = '\0';
    self->u16MaxNumElem = -(ushort)(u16MaxNumElems == 0) | u16MaxNumElems;
    self->u8ElemSize = u8ElemSize;
    self->u8ReadPtr = self->u8AllocBuf;
    self->u8WritePtr = self->u8AllocBuf;
  }
  return aVar2;
}

Assistant:

adt_buf_err_t adt_rbfh_createEx(adt_rbfh_t* self, uint8_t u8ElemSize, uint16_t u16MinNumElems, uint16_t u16MaxNumElems)
{
   if ( (self != 0) && (u8ElemSize > 0) && ( (u16MaxNumElems == 0) || (u16MaxNumElems > u16MinNumElems) ) )
   {
      if (u16MinNumElems > 0)
      {
         self->u8AllocBuf = (uint8_t*) malloc( ((uint32_t)u8ElemSize)*u16MinNumElems);
         if (self->u8AllocBuf == 0)
         {
            return BUF_E_NOT_OK;
         }
      }
      else
      {
         self->u8AllocBuf = (uint8_t*) 0;
      }
      self->u16NumElem = 0;
      self->u16AllocLen = u16MinNumElems;
      self->u16MaxNumElem = (u16MaxNumElems == 0)? USHRT_MAX : u16MaxNumElems;
      self->u8ElemSize = u8ElemSize;
      self->u8ReadPtr = self->u8AllocBuf;
      self->u8WritePtr = self->u8AllocBuf;
      return BUF_E_OK;
   }
   return BUF_E_NOT_OK;
}